

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O2

float basisu::kaiser_filter(float t)

{
  double dVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  
  fVar4 = -t;
  if (-t <= t) {
    fVar4 = t;
  }
  fVar3 = 0.0;
  if (fVar4 < 3.0) {
    dVar5 = sinc((double)fVar4);
    dVar1 = (double)fVar4 / 3.0;
    dVar1 = 1.0 - dVar1 * dVar1;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar1 = bessel0(dVar1 * 4.12258768081665);
    dVar2 = bessel0(4.12258768081665);
    dVar5 = dVar5 * (dVar1 / dVar2);
    fVar3 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar5)) {
      fVar3 = (float)dVar5;
    }
  }
  return fVar3;
}

Assistant:

static float kaiser_filter(float t)
	{
		if (t < 0.0f)
			t = -t;

		if (t < KAISER_SUPPORT)
		{
			// db atten
			const float att = 40.0f;
			const float alpha = (float)(exp(log((double)0.58417 * (att - 20.96)) * 0.4) + 0.07886 * (att - 20.96));
			//const float alpha = KAISER_ALPHA;
			return (float)clean(sinc(t) * kaiser(alpha, KAISER_SUPPORT, t));
		}

		return 0.0f;
	}